

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QDockAreaLayoutInfo * __thiscall
QMainWindowLayout::dockInfo(QMainWindowLayout *this,QWidget *widget)

{
  bool bVar1;
  const_iterator o;
  QDockWidgetGroupWindow **ppQVar2;
  undefined8 in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *dwgw;
  QList<QDockWidgetGroupWindow_*> *__range1;
  QDockAreaLayoutInfo *info;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDockWidgetGroupWindow_*> groups;
  FindChildOption in_stack_ffffffffffffff6c;
  QList<QDockWidgetGroupWindow_*> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QDockWidgetGroupWindow *widget_00;
  QDockAreaLayoutInfo *this_00;
  QFlagsStorage<Qt::FindChildOption> options;
  QDockAreaLayoutInfo *local_48;
  const_iterator local_30 [2];
  int *local_20;
  Data *local_18;
  QWidget **local_10;
  long local_8;
  
  options.i = (Int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = QDockAreaLayout::info
                       ((QDockAreaLayout *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  if (local_48 == (QDockAreaLayoutInfo *)0x0) {
    local_20 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    QObject::parent((QObject *)0x5f75e8);
    QFlags<Qt::FindChildOption>::QFlags
              ((QFlags<Qt::FindChildOption> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    QObject::findChildren<QDockWidgetGroupWindow*>
              (&in_RDI->super_QObject,(FindChildOptions)options.i);
    this_00 = (QDockAreaLayoutInfo *)&stack0xffffffffffffffe0;
    local_30[0].i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
    local_30[0] = QList<QDockWidgetGroupWindow_*>::begin(in_stack_ffffffffffffff70);
    o = QList<QDockWidgetGroupWindow_*>::end(in_stack_ffffffffffffff70);
    while (bVar1 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=(local_30,o), bVar1) {
      ppQVar2 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator*(local_30);
      widget_00 = *ppQVar2;
      QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f7696);
      local_48 = QDockAreaLayoutInfo::info(this_00,&widget_00->super_QWidget);
      if (local_48 != (QDockAreaLayoutInfo *)0x0) goto LAB_005f76e3;
      QList<QDockWidgetGroupWindow_*>::const_iterator::operator++(local_30);
    }
    local_48 = (QDockAreaLayoutInfo *)0x0;
LAB_005f76e3:
    QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x5f76ed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

QDockAreaLayoutInfo *QMainWindowLayout::dockInfo(QWidget *widget)
{
    QDockAreaLayoutInfo *info = layoutState.dockAreaLayout.info(widget);
    if (info)
        return info;
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        info = dwgw->layoutInfo()->info(widget);
        if (info)
            return info;
    }
    return nullptr;
}